

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<ParserError> * __thiscall
llvm_vecsmall::SmallVectorImpl<ParserError>::operator=
          (SmallVectorImpl<ParserError> *this,SmallVectorImpl<ParserError> *RHS)

{
  iterator MinSize;
  const_iterator pPVar1;
  const_iterator pPVar2;
  iterator pPVar3;
  iterator pPVar4;
  iterator E;
  ParserError *local_38;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<ParserError> *RHS_local;
  SmallVectorImpl<ParserError> *this_local;
  
  if (this != RHS) {
    MinSize = (iterator)
              SmallVectorTemplateCommon<ParserError,_void>::size
                        ((SmallVectorTemplateCommon<ParserError,_void> *)RHS);
    NewEnd = (iterator)
             SmallVectorTemplateCommon<ParserError,_void>::size
                       ((SmallVectorTemplateCommon<ParserError,_void> *)this);
    if (NewEnd < MinSize) {
      pPVar4 = (iterator)
               SmallVectorTemplateCommon<ParserError,_void>::capacity
                         ((SmallVectorTemplateCommon<ParserError,_void> *)this);
      if (pPVar4 < MinSize) {
        pPVar3 = SmallVectorTemplateCommon<ParserError,_void>::begin
                           ((SmallVectorTemplateCommon<ParserError,_void> *)this);
        E = SmallVectorTemplateCommon<ParserError,_void>::end
                      ((SmallVectorTemplateCommon<ParserError,_void> *)this);
        SmallVectorTemplateBase<ParserError,_false>::destroy_range(pPVar3,E);
        pPVar3 = SmallVectorTemplateCommon<ParserError,_void>::begin
                           ((SmallVectorTemplateCommon<ParserError,_void> *)this);
        SmallVectorTemplateCommon<ParserError,_void>::setEnd
                  ((SmallVectorTemplateCommon<ParserError,_void> *)this,pPVar3);
        NewEnd = (iterator)0x0;
        SmallVectorTemplateBase<ParserError,_false>::grow
                  (&this->super_SmallVectorTemplateBase<ParserError,_false>,(size_t)MinSize);
      }
      else if (NewEnd != (iterator)0x0) {
        pPVar1 = SmallVectorTemplateCommon<ParserError,_void>::begin
                           ((SmallVectorTemplateCommon<ParserError,_void> *)RHS);
        pPVar2 = SmallVectorTemplateCommon<ParserError,_void>::begin
                           ((SmallVectorTemplateCommon<ParserError,_void> *)RHS);
        pPVar3 = SmallVectorTemplateCommon<ParserError,_void>::begin
                           ((SmallVectorTemplateCommon<ParserError,_void> *)this);
        std::copy<ParserError_const*,ParserError*>(pPVar1,pPVar2 + (long)NewEnd,pPVar3);
      }
      pPVar1 = SmallVectorTemplateCommon<ParserError,_void>::begin
                         ((SmallVectorTemplateCommon<ParserError,_void> *)RHS);
      pPVar2 = SmallVectorTemplateCommon<ParserError,_void>::end
                         ((SmallVectorTemplateCommon<ParserError,_void> *)RHS);
      pPVar3 = SmallVectorTemplateCommon<ParserError,_void>::begin
                         ((SmallVectorTemplateCommon<ParserError,_void> *)this);
      SmallVectorTemplateBase<ParserError,false>::
      uninitialized_copy<ParserError_const*,ParserError*>
                (pPVar1 + (long)NewEnd,pPVar2,pPVar3 + (long)NewEnd);
      pPVar3 = SmallVectorTemplateCommon<ParserError,_void>::begin
                         ((SmallVectorTemplateCommon<ParserError,_void> *)this);
      SmallVectorTemplateCommon<ParserError,_void>::setEnd
                ((SmallVectorTemplateCommon<ParserError,_void> *)this,pPVar3 + (long)MinSize);
    }
    else {
      if (MinSize == (iterator)0x0) {
        local_38 = SmallVectorTemplateCommon<ParserError,_void>::begin
                             ((SmallVectorTemplateCommon<ParserError,_void> *)this);
      }
      else {
        pPVar1 = SmallVectorTemplateCommon<ParserError,_void>::begin
                           ((SmallVectorTemplateCommon<ParserError,_void> *)RHS);
        pPVar2 = SmallVectorTemplateCommon<ParserError,_void>::begin
                           ((SmallVectorTemplateCommon<ParserError,_void> *)RHS);
        pPVar3 = SmallVectorTemplateCommon<ParserError,_void>::begin
                           ((SmallVectorTemplateCommon<ParserError,_void> *)this);
        local_38 = std::copy<ParserError_const*,ParserError*>(pPVar1,pPVar2 + (long)MinSize,pPVar3);
      }
      pPVar3 = SmallVectorTemplateCommon<ParserError,_void>::end
                         ((SmallVectorTemplateCommon<ParserError,_void> *)this);
      SmallVectorTemplateBase<ParserError,_false>::destroy_range(local_38,pPVar3);
      SmallVectorTemplateCommon<ParserError,_void>::setEnd
                ((SmallVectorTemplateCommon<ParserError,_void> *)this,local_38);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}